

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

ContextRef VerifyContext(ALCcontext *context)

{
  __normal_iterator<ALCcontext_**,_std::vector<ALCcontext_*,_al::allocator<ALCcontext_*,_8UL>_>_>
  _Var1;
  ALCcontext *pAVar2;
  ALCcontext *in_RSI;
  ALCcontext *in_RDI;
  ALCcontext *local_18;
  
  local_18 = in_RSI;
  std::recursive_mutex::lock((recursive_mutex *)(anonymous_namespace)::ListLock);
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<ALCcontext**,std::vector<ALCcontext*,al::allocator<ALCcontext*,8ul>>>,ALCcontext*,__gnu_cxx::__ops::_Iter_less_val>
                    ((anonymous_namespace)::ContextList,DAT_001adba8,&local_18);
  if ((_Var1._M_current == DAT_001adba8) || (pAVar2 = *_Var1._M_current, pAVar2 != local_18)) {
    pAVar2 = (ALCcontext *)0x0;
  }
  else {
    LOCK();
    (pAVar2->super_intrusive_ref<ALCcontext>).mRef.super___atomic_base<unsigned_int>._M_i =
         (pAVar2->super_intrusive_ref<ALCcontext>).mRef.super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    pAVar2 = *_Var1._M_current;
  }
  *(ALCcontext **)in_RDI = pAVar2;
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
  return (ContextRef)in_RDI;
}

Assistant:

static ContextRef VerifyContext(ALCcontext *context)
{
    std::lock_guard<std::recursive_mutex> _{ListLock};
    auto iter = std::lower_bound(ContextList.begin(), ContextList.end(), context);
    if(iter != ContextList.end() && *iter == context)
    {
        (*iter)->add_ref();
        return ContextRef{*iter};
    }
    return nullptr;
}